

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void do_restart_interrupt(CPUS390XState_conflict *env)

{
  ulong uVar1;
  LowCore *buffer;
  uint64_t uVar2;
  CPUS390XState_conflict *__mptr;
  ulong uVar3;
  
  buffer = cpu_map_lowcore(env);
  uVar2 = get_psw_mask(env);
  (buffer->restart_old_psw).mask =
       uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
       (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  uVar1 = (env->psw).addr;
  (buffer->restart_old_psw).addr =
       uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
       (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
       (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  uVar1 = (buffer->restart_new_psw).mask;
  uVar3 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
          (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
          (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  uVar1 = (buffer->restart_new_psw).addr;
  cpu_physical_memory_unmap_s390x
            (*(AddressSpace **)(env[-0x1e].aregs + 2),buffer,0x2000,true,0x2000);
  *(byte *)&env->pending_int = (byte)env->pending_int & 0x7f;
  (env->psw).addr =
       uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
       (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
       (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
  uVar1 = (env->psw).mask;
  (env->psw).mask = uVar3;
  env->cc_op = (uint)(uVar3 >> 0x2c) & 3;
  if (((uVar1 ^ uVar3) >> 0x3e & 1) == 0) {
    return;
  }
  s390_cpu_recompute_watchpoints((CPUState *)(env[-0x1e].vregs + 0xf));
  return;
}

Assistant:

void do_restart_interrupt(CPUS390XState *env)
{
    uint64_t mask, addr;
    LowCore *lowcore;

    lowcore = cpu_map_lowcore(env);

    lowcore->restart_old_psw.mask = cpu_to_be64(get_psw_mask(env));
    lowcore->restart_old_psw.addr = cpu_to_be64(env->psw.addr);
    mask = be64_to_cpu(lowcore->restart_new_psw.mask);
    addr = be64_to_cpu(lowcore->restart_new_psw.addr);

    cpu_unmap_lowcore(env, lowcore);
    env->pending_int &= ~INTERRUPT_RESTART;

    load_psw(env, mask, addr);
}